

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

bool __thiscall QToolBarLayout::layoutActions(QToolBarLayout *this,QSize *size)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  QToolBarItem *pQVar4;
  Representation RVar5;
  Representation RVar6;
  byte bVar7;
  QRect QVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  int spacer;
  int iVar12;
  Orientation OVar13;
  int iVar14;
  LayoutDirection direction;
  int iVar15;
  QWidget *pQVar16;
  QStyle *pQVar17;
  pointer pQVar18;
  int extraout_var;
  int *piVar19;
  long lVar20;
  undefined8 uVar21;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  QWidgetAction *this_00;
  undefined4 extraout_var_02;
  int iVar22;
  int iVar23;
  QRect *pQVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  QPodArrayOps<QWidget*> *this_01;
  long lVar30;
  long lVar31;
  Representation RVar32;
  long in_FS_OFFSET;
  bool bVar33;
  QMargins QVar34;
  QStyleOptionToolBar opt;
  int local_18c;
  int local_188;
  int local_17c;
  int local_168;
  int local_160;
  int local_15c;
  int local_154;
  QRect local_128;
  QList<QLayoutStruct> local_118;
  undefined1 local_f8 [16];
  ulong local_e8;
  undefined1 local_d8 [16];
  ulong local_c8;
  QRect local_b8;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    updateGeomArray(this);
  }
  local_b8.x1.m_i = 0;
  local_b8.y1.m_i = 0;
  local_b8.y2.m_i = (*size).ht.m_i + -1;
  local_b8.x2.m_i = (*size).wd.m_i + -1;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = 0;
  local_f8 = (undefined1  [16])0x0;
  bVar9 = false;
  local_188 = 0;
  local_e8 = 0;
  QLayout::parentWidget(&this->super_QLayout);
  pQVar16 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (pQVar16 != (QWidget *)0x0) {
    pQVar17 = QWidget::style(pQVar16);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
    (**(code **)(*(long *)pQVar16 + 0x1a0))(pQVar16,(QStyleOptionToolBar *)local_98);
    bVar9 = movable(this);
    if (bVar9) {
      local_188 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x35,local_98,pQVar16);
    }
    QVar34 = QLayout::contentsMargins(&this->super_QLayout);
    spacer = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
    iVar12 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,0x39,local_98,pQVar16);
    OVar13 = QToolBar::orientation((QToolBar *)pQVar16);
    RVar5 = QVar34.m_left.m_i;
    RVar32 = QVar34.m_top.m_i;
    iVar29 = local_b8.y2.m_i - local_b8.y1.m_i;
    if (OVar13 == Horizontal) {
      iVar29 = local_b8.x2.m_i - local_b8.x1.m_i;
    }
    iVar23 = QVar34.m_bottom.m_i.m_i + RVar32.m_i;
    if (OVar13 == Horizontal) {
      iVar23 = QVar34.m_right.m_i.m_i + RVar5.m_i;
    }
    iVar29 = (iVar29 + 1) - (iVar23 + local_188);
    if (iVar29 < 1) {
      bVar9 = false;
    }
    else {
      if (this->popupMenu != (QMenu *)0x0) {
        QMenu::clear(this->popupMenu);
      }
      iVar23 = QVar34.m_bottom.m_i.m_i + RVar32.m_i;
      RVar6.m_i = RVar5.m_i;
      pQVar24 = (QRect *)&local_b8.y1;
      if (OVar13 == Vertical) {
        iVar23 = QVar34.m_right.m_i.m_i + RVar5.m_i;
        RVar6.m_i = RVar32.m_i;
        pQVar24 = &local_b8;
      }
      local_168 = RVar6.m_i + (pQVar24->x1).m_i;
      if (OVar13 == Horizontal) {
        RVar5.m_i = RVar32.m_i;
      }
      local_15c = 0;
      bVar9 = false;
      bVar10 = 1;
      iVar15 = 0;
      do {
        lVar25 = (long)iVar15;
        if ((this->items).d.size <= lVar25) break;
        local_118.d.d = (this->geomArray).d.d;
        local_118.d.ptr = (this->geomArray).d.ptr;
        local_118.d.size = (this->geomArray).d.size;
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_18c = 0;
        iVar28 = iVar15;
        if (lVar25 < (this->items).d.size) {
          local_160 = -1;
          bVar11 = 0;
          local_17c = 0;
          local_154 = 0;
          iVar22 = 0;
          local_18c = 0;
          lVar30 = lVar25;
          do {
            pQVar18 = QList<QLayoutStruct>::data(&local_118);
            if (pQVar18[lVar30].empty == false) {
              iVar27 = spacer;
              if (local_154 == 0) {
                iVar27 = 0;
              }
              pQVar18 = QList<QLayoutStruct>::data(&local_118);
              iVar27 = iVar27 + iVar22 + pQVar18[lVar30].minimumSize;
              bVar33 = local_160 != -1;
              if (iVar29 < iVar27 && bVar33) {
                if (local_15c == 0) {
                  bVar9 = true;
                }
                if ((1 < local_154) && (iVar29 < iVar12 + spacer + iVar22)) {
                  iVar28 = local_160;
                }
              }
              else {
                iVar22 = local_18c;
                if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
                  iVar14 = (*((this->items).d.ptr[lVar30]->super_QWidgetItem).super_QLayoutItem.
                             _vptr_QLayoutItem[2])();
                  iVar22 = extraout_var;
                  if (OVar13 == Vertical) {
                    iVar22 = iVar14;
                  }
                  if (iVar22 < local_18c) {
                    iVar22 = local_18c;
                  }
                }
                local_18c = iVar22;
                bVar7 = bVar11 & 1;
                bVar11 = 1;
                if (bVar7 == 0) {
                  pQVar18 = QList<QLayoutStruct>::data(&local_118);
                  bVar11 = pQVar18[lVar30].expansive;
                }
                pQVar18 = QList<QLayoutStruct>::data(&local_118);
                bVar1 = pQVar18[lVar30].expansive;
                pQVar18 = QList<QLayoutStruct>::data(&local_118);
                if (bVar1 == true) {
                  piVar19 = &pQVar18[lVar30].maximumSize;
                }
                else {
                  piVar19 = &pQVar18[lVar30].sizeHint + (ulong)(0 < pQVar18[lVar30].stretch) * 2;
                }
                local_17c = local_17c + spacer + *piVar19;
                local_154 = local_154 + 1;
                local_160 = iVar28;
                iVar22 = iVar27;
              }
              if (iVar29 < iVar27 && bVar33) break;
            }
            iVar28 = iVar28 + 1;
            lVar30 = (long)iVar28;
          } while (lVar30 < (this->items).d.size);
        }
        else {
          local_17c = 0;
          bVar11 = 0;
        }
        lVar30 = (long)iVar28;
        pQVar18 = QList<QLayoutStruct>::data(&local_118);
        pQVar18[lVar30].sizeHint = 0;
        pQVar18 = QList<QLayoutStruct>::data(&local_118);
        pQVar18[lVar30].maximumSize = 0xffffff;
        pQVar18 = QList<QLayoutStruct>::data(&local_118);
        pQVar18[lVar30].minimumSize = 0;
        pQVar18 = QList<QLayoutStruct>::data(&local_118);
        pQVar18[lVar30].expansive = true;
        pQVar18 = QList<QLayoutStruct>::data(&local_118);
        pQVar18[lVar30].stretch = 0;
        pQVar18 = QList<QLayoutStruct>::data(&local_118);
        pQVar18[lVar30].empty = true;
        if (((bVar11 & 1) != 0) && (iVar29 - local_17c != 0 && local_17c <= iVar29)) {
          pQVar18 = QList<QLayoutStruct>::data(&local_118);
          pQVar18[lVar30].maximumSize = iVar29 - local_17c;
          bVar11 = 0;
        }
        iVar22 = 0;
        if (bVar9) {
          iVar22 = iVar12 + spacer;
        }
        qGeomCalc(&local_118,iVar15,(iVar28 - iVar15) + (uint)(~bVar11 & 1),0,iVar29 - iVar22,spacer
                 );
        if (iVar15 < iVar28) {
          lVar31 = iVar28 - lVar25;
          lVar25 = lVar25 << 3;
          do {
            plVar3 = *(long **)((long)(this->items).d.ptr + lVar25);
            pQVar18 = QList<QLayoutStruct>::data(&local_118);
            if ((&pQVar18->empty)[lVar25 * 4] == true) {
              lVar20 = (**(code **)(*plVar3 + 0x68))(plVar3);
              if ((*(byte *)(*(long *)(lVar20 + 0x20) + 10) & 1) == 0) {
                uVar21 = (**(code **)(*plVar3 + 0x68))(plVar3);
                local_128.x1.m_i = (int)uVar21;
                local_128.y1.m_i = (int)((ulong)uVar21 >> 0x20);
                this_01 = (QPodArrayOps<QWidget*> *)local_f8;
                pQVar24 = &local_128;
                uVar26 = local_e8;
LAB_004bebf0:
                QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                          (this_01,uVar26,(QWidget **)pQVar24);
                QList<QWidget_*>::end((QList<QWidget_*> *)this_01);
              }
            }
            else {
              pQVar18 = QList<QLayoutStruct>::data(&local_118);
              iVar15 = (&pQVar18->pos)[lVar25] + RVar5.m_i + local_188;
              pQVar18 = QList<QLayoutStruct>::data(&local_118);
              local_128.x1.m_i = 0;
              if (OVar13 == Horizontal) {
                local_128.x1.m_i = iVar15;
              }
              iVar22 = (&pQVar18->size)[lVar25];
              iVar27 = -1;
              if (OVar13 == Horizontal) {
                iVar27 = iVar22;
              }
              local_128.y1.m_i = local_168;
              if (OVar13 == Vertical) {
                local_128.x1.m_i = local_168;
                local_128.y1.m_i = iVar15;
              }
              iVar15 = local_18c;
              if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') {
                iVar15 = local_b8.y2.m_i - local_b8.y1.m_i;
                if (OVar13 == Vertical) {
                  iVar15 = local_b8.x2.m_i - local_b8.x1.m_i;
                }
                iVar15 = (iVar15 - iVar23) + 1;
              }
              if (OVar13 != Vertical) {
                iVar22 = iVar15;
                iVar15 = iVar27;
              }
              local_128.x2.m_i = local_128.x1.m_i + -1 + iVar15;
              local_128.y2.m_i = iVar22 + local_128.y1.m_i + -1;
              if (OVar13 == Horizontal) {
                pQVar16 = QLayout::parentWidget(&this->super_QLayout);
                direction = QWidget::layoutDirection(pQVar16);
                local_128 = QStyle::visualRect(direction,&local_b8,&local_128);
              }
              (**(code **)(*plVar3 + 0x30))(plVar3,&local_128);
              lVar20 = (**(code **)(*plVar3 + 0x68))(plVar3);
              if ((*(byte *)(*(long *)(lVar20 + 0x20) + 10) & 1) != 0) {
                local_a0 = (undefined1  [8])(**(code **)(*plVar3 + 0x68))(plVar3);
                this_01 = (QPodArrayOps<QWidget*> *)local_d8;
                pQVar24 = (QRect *)local_a0;
                uVar26 = local_c8;
                goto LAB_004bebf0;
              }
            }
            lVar25 = lVar25 + 8;
            lVar31 = lVar31 + -1;
          } while (lVar31 != 0);
        }
        cVar2 = (this->super_QLayout).super_QLayoutItem.field_0xc;
        if (cVar2 == '\0') {
          for (; lVar30 < (this->items).d.size; lVar30 = lVar30 + 1) {
            pQVar4 = (this->items).d.ptr[lVar30];
            iVar15 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar4)
            ;
            if ((*(byte *)(*(long *)(CONCAT44(extraout_var_00,iVar15) + 0x20) + 10) & 1) == 0) {
              iVar15 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])
                                 (pQVar4);
              QVar8 = local_128;
              local_128.y1.m_i = extraout_var_01;
              local_128.x1.m_i = iVar15;
              local_128._8_8_ = QVar8._8_8_;
              QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                        ((QPodArrayOps<QWidget*> *)local_f8,local_e8,(QWidget **)&local_128);
              QList<QWidget_*>::end((QList<QWidget_*> *)local_f8);
            }
            if (this->popupMenu != (QMenu *)0x0) {
              this_00 = (QWidgetAction *)
                        QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
              if (this_00 != (QWidgetAction *)0x0) {
                pQVar16 = QWidgetAction::defaultWidget(this_00);
                iVar15 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])
                                   (pQVar4);
                if (pQVar16 == (QWidget *)CONCAT44(extraout_var_02,iVar15)) goto LAB_004bed19;
              }
              QWidget::addAction(&this->popupMenu->super_QWidget,pQVar4->action);
              bVar10 = 0;
            }
LAB_004bed19:
          }
        }
        else {
          local_168 = local_168 + spacer + local_18c;
          local_15c = local_15c + 1;
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,0x20,0x10);
          }
        }
        iVar15 = iVar28;
      } while (cVar2 != '\0');
      QWidget::setEnabled((QWidget *)this->extension,
                          (bool)(~bVar10 & 1 | this->popupMenu == (QMenu *)0x0));
      if (local_c8 != 0) {
        uVar26 = 0;
        do {
          QWidget::show(*(QWidget **)(local_d8._8_8_ + uVar26 * 8));
          uVar26 = uVar26 + 1;
        } while (uVar26 < local_c8);
      }
      if (local_e8 != 0) {
        uVar26 = 0;
        do {
          QWidget::hide(*(QWidget **)(local_f8._8_8_ + uVar26 * 8));
          uVar26 = uVar26 + 1;
        } while (uVar26 < local_e8);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
  if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8._0_8_,8,0x10);
    }
  }
  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QToolBarLayout::layoutActions(const QSize &size)
{
    if (dirty)
        updateGeomArray();

    QRect rect(0, 0, size.width(), size.height());

    QList<QWidget*> showWidgets, hideWidgets;

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();
    bool extensionMenuContainsOnlyWidgetActions = true;

    int space = pick(o, rect.size()) - pick(o, margins) - handleExtent;
    if (space <= 0)
        return false;  // nothing to do.

    if (popupMenu)
        popupMenu->clear();

    bool ranOutOfSpace = false;
    int rows = 0;
    int rowPos = perp(o, rect.topLeft()) + perp(o, QSize(margins.top(), margins.left()));
    int i = 0;
    while (i < items.size()) {
        QList<QLayoutStruct> a = geomArray;

        int start = i;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        int count = 0;
        int maximumSize = 0;
        bool expansiveRow = false;
        for (; i < items.size(); ++i) {
            if (a[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + a[i].minimumSize;
            if (prev != -1 && newSize > space) {
                if (rows == 0)
                    ranOutOfSpace = true;
                // do we have to move the previous item to the next line to make space for
                // the extension button?
                if (count > 1 && size + spacing + extensionExtent > space)
                    i = prev;
                break;
            }

            if (expanded)
                rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            expansiveRow = expansiveRow || a[i].expansive;
            size = newSize;
            maximumSize += spacing + (a[i].expansive ? a[i].maximumSize : a[i].smartSizeHint());
            prev = i;
            ++count;
        }

        // stretch at the end
        a[i].sizeHint = 0;
        a[i].maximumSize = QWIDGETSIZE_MAX;
        a[i].minimumSize = 0;
        a[i].expansive = true;
        a[i].stretch = 0;
        a[i].empty = true;

        if (expansiveRow && maximumSize < space) {
            expansiveRow = false;
            a[i].maximumSize = space - maximumSize;
        }

        qGeomCalc(a, start, i - start + (expansiveRow ? 0 : 1), 0,
                    space - (ranOutOfSpace ? (extensionExtent + spacing) : 0),
                    spacing);

        for (int j = start; j < i; ++j) {
            QToolBarItem *item = items.at(j);

            if (a[j].empty) {
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                continue;
            }

            QPoint pos;
            rpick(o, pos) = pick(o, QSize(margins.top(), margins.left())) + handleExtent + a[j].pos;
            rperp(o, pos) = rowPos;
            QSize size;
            rpick(o, size) = a[j].size;
            if (expanded)
                rperp(o, size) = rowHeight;
            else
                rperp(o, size) = perp(o, rect.size()) - perp(o, margins);
            QRect r(pos, size);

            if (o == Qt::Horizontal)
                r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

            item->setGeometry(r);

            if (item->widget()->isHidden())
                showWidgets << item->widget();
        }

        if (!expanded) {
            for (int j = i; j < items.size(); ++j) {
                QToolBarItem *item = items.at(j);
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                if (popupMenu) {
                    if (!defaultWidgetAction(item)) {
                        popupMenu->addAction(item->action);
                        extensionMenuContainsOnlyWidgetActions = false;
                    }
                }
            }
            break;
        }

        rowPos += rowHeight + spacing;
        ++rows;
    }

    // if we are using a popup menu, not the expadning toolbar effect, we cannot move custom
    // widgets into the menu. If only custom widget actions are chopped off, the popup menu
    // is empty. So we show the little extension button to show something is chopped off,
    // but we make it disabled.
    extension->setEnabled(popupMenu == nullptr || !extensionMenuContainsOnlyWidgetActions);

    // we have to do the show/hide here, because it triggers more calls to setGeometry :(
    for (int i = 0; i < showWidgets.size(); ++i)
        showWidgets.at(i)->show();
    for (int i = 0; i < hideWidgets.size(); ++i)
        hideWidgets.at(i)->hide();

    return ranOutOfSpace;
}